

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  const_iterator __position;
  const_iterator __position_00;
  initializer_list<int> __l;
  FILE *pFVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int64_t iVar5;
  time_t tVar6;
  char *pcVar7;
  int64_t iVar8;
  size_type sVar9;
  reference piVar10;
  size_type sVar11;
  reference pvVar12;
  int64_t t_main_end_us;
  vector<int,_std::allocator<int>_> line_inp;
  int n_read;
  char buf [256];
  bool another_line;
  int id_1;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  int64_t t_start_sample_us;
  id id;
  int n_vocab;
  float repeat_penalty;
  float temp;
  float top_p;
  float top_k;
  int64_t t_start_us_1;
  bool input_noecho;
  int input_consumed;
  int remaining_tokens;
  vector<int,_std::allocator<int>_> last_n_tokens;
  int last_n_size;
  size_t mem_per_token;
  vector<int,_std::allocator<int>_> embd;
  sigaction sigint_action;
  vector<int,_std::allocator<int>_> param_inp;
  vector<int,_std::allocator<int>_> response_inp;
  vector<int,_std::allocator<int>_> prompt_inp;
  vector<int,_std::allocator<int>_> instruct_inp;
  vector<int,_std::allocator<int>_> embd_inp;
  vector<float,_std::allocator<float>_> logits;
  int64_t t_predict_us;
  int64_t t_sample_us;
  int n_past;
  int64_t t_start_us;
  llama_model model;
  gpt_vocab vocab;
  int64_t t_load_us;
  mt19937 rng;
  gpt_params params;
  int64_t t_main_start_us;
  size_t *in_stack_00016618;
  vector<float,_std::allocator<float>_> *in_stack_00016620;
  vector<int,_std::allocator<int>_> *in_stack_00016628;
  int in_stack_00016630;
  int in_stack_00016634;
  llama_model *in_stack_00016638;
  undefined7 in_stack_ffffffffffffe378;
  undefined1 in_stack_ffffffffffffe37f;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe380;
  undefined4 in_stack_ffffffffffffe388;
  undefined4 in_stack_ffffffffffffe38c;
  float fVar13;
  char *in_stack_ffffffffffffe390;
  undefined7 in_stack_ffffffffffffe398;
  undefined1 in_stack_ffffffffffffe39f;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe3a0;
  allocator_type *in_stack_ffffffffffffe3a8;
  allocator<char> *in_stack_ffffffffffffe3b0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe3b8;
  gpt_params *in_stack_ffffffffffffe3c0;
  iterator in_stack_ffffffffffffe3c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffe3d0;
  const_iterator in_stack_ffffffffffffe3d8;
  undefined8 in_stack_ffffffffffffe498;
  undefined1 bos;
  undefined8 *puVar14;
  undefined4 in_stack_ffffffffffffe4a0;
  undefined4 in_stack_ffffffffffffe4a4;
  gpt_vocab *in_stack_ffffffffffffe4a8;
  gpt_vocab *vocab_00;
  iterator in_stack_ffffffffffffe5a8;
  iterator in_stack_ffffffffffffe5b0;
  iterator in_stack_ffffffffffffe5b8;
  iterator in_stack_ffffffffffffe5c0;
  double in_stack_ffffffffffffe5c8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe5d0;
  float *in_stack_ffffffffffffe5d8;
  gpt_vocab *in_stack_ffffffffffffe5e0;
  vector<int,_std::allocator<int>_> local_1a08;
  int local_19ec;
  char local_19e8 [263];
  byte local_18e1;
  int *local_18e0;
  int *local_18d8;
  int *local_18d0;
  int *local_18c8;
  int local_18b4;
  int *local_18b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18a8;
  undefined1 *local_18a0;
  int *local_1898;
  int *local_1890;
  int *local_1880;
  int *local_1878;
  int64_t local_1868;
  id local_1860;
  undefined4 local_185c;
  float local_184c;
  int64_t local_1848;
  byte local_183d;
  int local_183c;
  int local_1838;
  undefined4 local_1834;
  int *local_1830;
  int *local_1828;
  allocator<int> local_1819 [32];
  undefined1 local_17f9 [89];
  code *local_17a0;
  gpt_params *in_stack_ffffffffffffe8b0;
  char **in_stack_ffffffffffffe8b8;
  int in_stack_ffffffffffffe8c4;
  allocator<char> local_1649 [33];
  vector<int,_std::allocator<int>_> local_1628;
  allocator<char> local_1609 [33];
  vector<int,_std::allocator<int>_> local_15e8;
  allocator<char> local_15c9 [57];
  undefined1 local_1590 [48];
  size_type local_1560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1558;
  _Alloc_hider local_1548;
  undefined4 local_1540;
  int local_153c;
  long local_1448;
  int in_stack_fffffffffffff3b4;
  gpt_vocab *in_stack_fffffffffffff3b8;
  llama_model *in_stack_fffffffffffff3c0;
  string *in_stack_fffffffffffff3c8;
  uint local_a8;
  uint local_a4;
  uint local_9c;
  uint local_94;
  float local_90;
  float local_8c;
  float local_88;
  int local_84;
  byte local_40;
  byte local_3f;
  byte local_3e;
  int local_4;
  
  bos = (undefined1)((ulong)in_stack_ffffffffffffe498 >> 0x38);
  ggml_time_init();
  iVar5 = ggml_time_us();
  gpt_params::gpt_params(in_stack_ffffffffffffe3c0);
  bVar2 = gpt_params_parse(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8b8,
                           in_stack_ffffffffffffe8b0);
  if (bVar2) {
    if ((int)local_a8 < 0) {
      tVar6 = time((time_t *)0x0);
      local_a8 = (uint)tVar6;
    }
    fprintf(_stderr,"%s: seed = %d\n","main",(ulong)local_a8);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine
              (in_stack_ffffffffffffe380,
               CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
    local_1448 = 0;
    gpt_vocab::gpt_vocab((gpt_vocab *)in_stack_ffffffffffffe380);
    llama_model::llama_model((llama_model *)in_stack_ffffffffffffe380);
    local_1548._M_p = (pointer)ggml_time_us();
    bVar2 = llama_model_load(in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
                             in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4);
    pFVar1 = _stderr;
    if (bVar2) {
      iVar8 = ggml_time_us();
      local_1448 = iVar8 - (long)local_1548._M_p;
      fprintf(_stderr,"\n");
      pFVar1 = _stderr;
      uVar3 = std::thread::hardware_concurrency();
      pcVar7 = llama_print_system_info();
      fprintf(pFVar1,"system_info: n_threads = %d / %d | %s\n",(ulong)local_a4,(ulong)uVar3,pcVar7);
      local_1558._12_4_ = 0;
      local_1558._M_allocated_capacity = 0;
      local_1560 = 0;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x10d561);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10d56e);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe3c0,(char *)in_stack_ffffffffffffe3b8,
                 in_stack_ffffffffffffe3b0);
      llama_tokenize(in_stack_ffffffffffffe4a8,
                     (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
                     (bool)bos);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe380);
      std::allocator<char>::~allocator(local_15c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe3c0,(char *)in_stack_ffffffffffffe3b8,
                 in_stack_ffffffffffffe3b0);
      llama_tokenize(in_stack_ffffffffffffe4a8,
                     (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
                     (bool)bos);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe380);
      std::allocator<char>::~allocator(local_1609);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe3c0,(char *)in_stack_ffffffffffffe3b8,
                 in_stack_ffffffffffffe3b0);
      llama_tokenize(in_stack_ffffffffffffe4a8,
                     (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
                     (bool)bos);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe380);
      std::allocator<char>::~allocator(local_1649);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_ffffffffffffe380,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
      std::vector<int,std::allocator<int>>::
      insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe3c0,
                 in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 in_stack_ffffffffffffe3c8._M_current);
      bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x10d772);
      if (!bVar2) {
        llama_tokenize(in_stack_ffffffffffffe4a8,
                       (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
                       (bool)bos);
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
        __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
        __normal_iterator<int*>
                  ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   in_stack_ffffffffffffe380,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
        std::vector<int,_std::allocator<int>_>::begin
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
        std::vector<int,std::allocator<int>>::
        insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe3c0,
                   in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   in_stack_ffffffffffffe3c8._M_current);
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
        __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
        __normal_iterator<int*>
                  ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   in_stack_ffffffffffffe380,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
        std::vector<int,_std::allocator<int>_>::begin
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
        std::vector<int,std::allocator<int>>::
        insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe3c0,
                   in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   in_stack_ffffffffffffe3c8._M_current);
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
        __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
        __normal_iterator<int*>
                  ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   in_stack_ffffffffffffe380,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
        std::vector<int,_std::allocator<int>_>::begin
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
        std::vector<int,std::allocator<int>>::
        insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe3c0,
                   in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   in_stack_ffffffffffffe3c8._M_current);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe390);
      }
      if ((local_3f & 1) != 0) {
        local_17a0 = sigint_handler;
        sigemptyset((sigset_t *)&stack0xffffffffffffe868);
        sigaction(2,(sigaction *)&local_17a0,(sigaction *)0x0);
        fprintf(_stderr,"%s: interactive mode on.\n","main");
      }
      puVar14 = (undefined8 *)&stderr;
      fprintf(_stderr,
              "sampling parameters: temp = %f, top_k = %d, top_p = %f, repeat_last_n = %i, repeat_penalty = %f\n"
              ,(double)local_8c,(double)local_90,(double)local_88,(ulong)local_94,(ulong)local_9c);
      fprintf((FILE *)*puVar14,"\n\n");
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10db98);
      local_17f9._57_8_ = 0;
      local_17f9._1_4_ = 0;
      local_17f9._5_4_ = 1;
      local_17f9._9_4_ = 2;
      local_17f9._13_4_ = 3;
      local_17f9._17_8_ = local_17f9 + 1;
      local_17f9._25_8_ = 4;
      vocab_00 = (gpt_vocab *)local_17f9;
      std::allocator<int>::allocator((allocator<int> *)0x10dc0f);
      __l._M_len = (size_type)in_stack_ffffffffffffe3c0;
      __l._M_array = (iterator)in_stack_ffffffffffffe3b8;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe3b0,__l,
                 in_stack_ffffffffffffe3a8);
      llama_eval(in_stack_00016638,in_stack_00016634,in_stack_00016630,in_stack_00016628,
                 in_stack_00016620,in_stack_00016618);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe390);
      std::allocator<int>::~allocator((allocator<int> *)local_17f9);
      std::allocator<int>::allocator((allocator<int> *)0x10dcb3);
      std::vector<int,_std::allocator<int>_>::vector
                (in_stack_ffffffffffffe3a0,
                 CONCAT17(in_stack_ffffffffffffe39f,in_stack_ffffffffffffe398),
                 (allocator_type *)in_stack_ffffffffffffe390);
      std::allocator<int>::~allocator(local_1819);
      local_1828 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                    ((vector<int,_std::allocator<int>_> *)
                                     CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
      local_1830 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)
                                     CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
      local_1834 = 0;
      __last._M_current._4_4_ = in_stack_ffffffffffffe38c;
      __last._M_current._0_4_ = in_stack_ffffffffffffe388;
      std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 in_stack_ffffffffffffe390,__last,(int *)in_stack_ffffffffffffe380);
      if ((local_3f & 1) != 0) {
        fprintf(_stderr,
                "== Running in chat mode. ==\n - Press Ctrl+C to interject at any time.\n - Press Return to return control to LLaMA.\n - If you want to submit another line, end your input in \'\\\'.\n"
               );
      }
      sVar9 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_1590);
      local_1838 = local_153c - (int)sVar9;
      local_183c = 0;
      local_183d = 1;
      if ((local_3e & 1) != 0) {
        is_interacting = true;
      }
      if ((local_40 & 1) != 0) {
        printf("\x1b[33m");
      }
      while (0 < local_1838) {
        sVar9 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(local_17f9 + 0x41));
        if (sVar9 != 0) {
          local_1848 = ggml_time_us();
          bVar2 = llama_eval(in_stack_00016638,in_stack_00016634,in_stack_00016630,in_stack_00016628
                             ,in_stack_00016620,in_stack_00016618);
          if (!bVar2) {
            fprintf(_stderr,"Failed to predict\n");
            local_4 = 1;
            goto LAB_0010ea8c;
          }
          iVar8 = ggml_time_us();
          local_1560 = (iVar8 - local_1848) + local_1560;
        }
        sVar9 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(local_17f9 + 0x41));
        local_1558._12_4_ = local_1558._12_4_ + (int)sVar9;
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x10df80)
        ;
        sVar9 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_1590);
        if (((ulong)(long)local_183c < sVar9) || ((is_interacting & 1U) != 0)) {
          do {
            sVar9 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)local_1590);
            if (sVar9 <= (ulong)(long)local_183c) break;
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_1590,(long)local_183c);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe390,
                       (value_type_conflict2 *)
                       CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
            local_1890 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                          ((vector<int,_std::allocator<int>_> *)
                                           CONCAT17(in_stack_ffffffffffffe37f,
                                                    in_stack_ffffffffffffe378));
            __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
            __normal_iterator<int*>
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffe380,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
            __position_00._M_current._7_1_ = in_stack_ffffffffffffe39f;
            __position_00._M_current._0_7_ = in_stack_ffffffffffffe398;
            local_1898 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                          ((vector<int,_std::allocator<int>_> *)
                                           in_stack_ffffffffffffe390,__position_00);
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_1590,(long)local_183c);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe390,
                       (value_type_conflict2 *)
                       CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
            local_183c = local_183c + 1;
            sVar9 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)(local_17f9 + 0x41));
          } while (sVar9 <= (ulong)(long)local_84);
          if ((((local_183d & 1) == 0) && ((local_40 & 1) != 0)) &&
             (sVar9 = std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)local_1590),
             sVar9 == (long)local_183c)) {
            printf("\x1b[0m");
          }
        }
        else {
          local_184c = (float)(int)local_94;
          local_185c = local_1540;
          local_1860 = 0;
          local_1868 = ggml_time_us();
          std::vector<float,_std::allocator<float>_>::data
                    ((vector<float,_std::allocator<float>_> *)0x10e040);
          std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)(local_1590 + 0x18));
          local_1860 = llama_sample_top_p_top_k
                                 (in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8,
                                  in_stack_ffffffffffffe5d0,in_stack_ffffffffffffe5c8,
                                  (int)((ulong)in_stack_ffffffffffffe5c0._M_current >> 0x20),
                                  (double)in_stack_ffffffffffffe5b8._M_current,
                                  (double)in_stack_ffffffffffffe5b0._M_current,
                                  (mt19937 *)in_stack_ffffffffffffe5a8._M_current);
          local_1878 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                        ((vector<int,_std::allocator<int>_> *)
                                         CONCAT17(in_stack_ffffffffffffe37f,
                                                  in_stack_ffffffffffffe378));
          __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
          __normal_iterator<int*>
                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffe380,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
          __position._M_current._7_1_ = in_stack_ffffffffffffe39f;
          __position._M_current._0_7_ = in_stack_ffffffffffffe398;
          local_1880 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                        ((vector<int,_std::allocator<int>_> *)
                                         in_stack_ffffffffffffe390,__position);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe390,
                     (value_type_conflict2 *)
                     CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
          iVar8 = ggml_time_us();
          local_1558._M_allocated_capacity = local_1558._M_allocated_capacity + (iVar8 - local_1868)
          ;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe390,
                     (value_type_conflict2 *)
                     CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
          local_183d = 0;
          local_1838 = local_1838 + -1;
        }
        if ((local_183d & 1) == 0) {
          local_18a0 = local_17f9 + 0x41;
          local_18a8._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
          local_18b0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                        ((vector<int,_std::allocator<int>_> *)
                                         CONCAT17(in_stack_ffffffffffffe37f,
                                                  in_stack_ffffffffffffe378));
          while (bVar2 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_ffffffffffffe380,
                                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378)
                                   ), ((bVar2 ^ 0xffU) & 1) != 0) {
            piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&local_18a8);
            local_18b4 = *piVar10;
            std::
            map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffe3c0,(key_type *)in_stack_ffffffffffffe3b8);
            pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe380);
            printf("%s",pcVar7);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&local_18a8);
          }
          fflush(_stdout);
        }
        if ((((local_3f & 1) != 0) &&
            (sVar9 = std::vector<int,_std::allocator<int>_>::size
                               ((vector<int,_std::allocator<int>_> *)local_1590),
            sVar9 <= (ulong)(long)local_183c)) && ((is_interacting & 1U) != 0)) {
          sVar9 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_1590);
          local_183c = (int)sVar9;
          local_18c8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                        ((vector<int,_std::allocator<int>_> *)
                                         CONCAT17(in_stack_ffffffffffffe37f,
                                                  in_stack_ffffffffffffe378));
          __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
          __normal_iterator<int*>
                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffe380,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
          local_18d0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                        ((vector<int,_std::allocator<int>_> *)
                                         CONCAT17(in_stack_ffffffffffffe37f,
                                                  in_stack_ffffffffffffe378));
          local_18d8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                        ((vector<int,_std::allocator<int>_> *)
                                         CONCAT17(in_stack_ffffffffffffe37f,
                                                  in_stack_ffffffffffffe378));
          local_18e0 = (int *)std::vector<int,std::allocator<int>>::
                              insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                                        ((vector<int,_std::allocator<int>_> *)
                                         in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3d8,
                                         in_stack_ffffffffffffe3d0,
                                         in_stack_ffffffffffffe3c8._M_current);
          printf("\n> ");
          local_18e1 = 1;
          while ((local_18e1 & 1) != 0) {
            fflush(_stdout);
            memset(local_19e8,0,0x100);
            if ((local_40 & 1) != 0) {
              printf("\x1b[1m\x1b[32m");
            }
            iVar4 = __isoc99_scanf("%255[^\n]%n%*c",local_19e8,&local_19ec);
            if (iVar4 < 1) {
              __isoc99_scanf("%*c");
              local_19ec = 0;
            }
            if ((local_40 & 1) != 0) {
              printf("\x1b[0m");
            }
            if ((local_19ec < 1) || (local_19e8[local_19ec + -1] != '\\')) {
              local_18e1 = 0;
              local_19e8[local_19ec] = '\n';
              local_19e8[local_19ec + 1] = '\0';
            }
            else {
              local_18e1 = 1;
              local_19e8[local_19ec + -1] = '\n';
              local_19e8[local_19ec] = '\0';
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe3c0,(char *)in_stack_ffffffffffffe3b8,
                       in_stack_ffffffffffffe3b0);
            llama_tokenize(vocab_00,(string *)CONCAT44(local_a4,in_stack_ffffffffffffe4a0),
                           SUB81((ulong)puVar14 >> 0x38,0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe380);
            std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffe5d7);
            in_stack_ffffffffffffe3d8._M_current = (int *)local_1590;
            in_stack_ffffffffffffe5c0 =
                 std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
            __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
            __normal_iterator<int*>
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffe380,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
            in_stack_ffffffffffffe3d0._M_current = (int *)&local_1a08;
            in_stack_ffffffffffffe5b8 =
                 std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
            in_stack_ffffffffffffe5b0 =
                 std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
            in_stack_ffffffffffffe5a8 =
                 std::vector<int,std::allocator<int>>::
                 insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                           ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe3c0,
                            in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
                            in_stack_ffffffffffffe3c8._M_current);
            in_stack_ffffffffffffe3c0 = (gpt_params *)local_1590;
            std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
            __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
            __normal_iterator<int*>
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffe380,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
            in_stack_ffffffffffffe3b8 = &local_1628;
            std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
            std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378));
            in_stack_ffffffffffffe3c8 =
                 std::vector<int,std::allocator<int>>::
                 insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                           ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe3c0,
                            in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d0,
                            in_stack_ffffffffffffe3c8._M_current);
            sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_15e8);
            sVar11 = std::vector<int,_std::allocator<int>_>::size(&local_1a08);
            in_stack_ffffffffffffe3b0 = (allocator<char> *)(sVar9 + sVar11);
            sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_1628);
            local_1838 = local_1838 - ((int)in_stack_ffffffffffffe3b0 + (int)sVar9);
            local_183d = 1;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe390);
          }
          is_interacting = false;
        }
        pvVar12 = std::vector<int,_std::allocator<int>_>::back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe380);
        if (*pvVar12 == 2) {
          if ((local_3f & 1) == 0) {
            printf("\n");
            fprintf(_stderr," [end of text]\n");
            break;
          }
          is_interacting = true;
        }
      }
      iVar8 = ggml_time_us();
      in_stack_ffffffffffffe380 =
           (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)&stderr;
      fprintf(_stderr,"\n\n");
      in_stack_ffffffffffffe390 = "main";
      fprintf((FILE *)in_stack_ffffffffffffe380->_M_x[0],"%s: mem per token = %8zu bytes\n","main",
              local_17f9._57_8_);
      fVar13 = 1000.0;
      fprintf((FILE *)in_stack_ffffffffffffe380->_M_x[0],"%s:     load time = %8.2f ms\n",
              (double)((float)local_1448 / 1000.0),in_stack_ffffffffffffe390);
      fprintf((FILE *)in_stack_ffffffffffffe380->_M_x[0],"%s:   sample time = %8.2f ms\n",
              (double)((float)(long)local_1558._M_allocated_capacity / fVar13),
              in_stack_ffffffffffffe390);
      fprintf((FILE *)in_stack_ffffffffffffe380->_M_x[0],
              "%s:  predict time = %8.2f ms / %.2f ms per token\n",
              (double)((float)(long)local_1560 / fVar13),
              (double)(((float)(long)local_1560 / fVar13) / (float)(int)local_1558._12_4_),
              in_stack_ffffffffffffe390);
      fprintf((FILE *)in_stack_ffffffffffffe380->_M_x[0],"%s:    total time = %8.2f ms\n",
              (double)((float)(iVar8 - iVar5) / fVar13),in_stack_ffffffffffffe390);
      ggml_free((ggml_context *)in_stack_ffffffffffffe380);
      if ((local_40 & 1) != 0) {
        printf("\x1b[0m");
      }
      local_4 = 0;
LAB_0010ea8c:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe390);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe390);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe390);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe390);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe390);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe390);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe390);
    }
    else {
      pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe380);
      fprintf(pFVar1,"%s: failed to load model from \'%s\'\n","main",pcVar7);
      local_4 = 1;
    }
    llama_model::~llama_model((llama_model *)in_stack_ffffffffffffe380);
    gpt_vocab::~gpt_vocab((gpt_vocab *)in_stack_ffffffffffffe380);
  }
  else {
    local_4 = 1;
  }
  gpt_params::~gpt_params((gpt_params *)in_stack_ffffffffffffe380);
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();
    const int64_t t_main_start_us = ggml_time_us();

    gpt_params params;

    if (gpt_params_parse(argc, argv, params) == false) {
        return 1;
    }

    if (params.seed < 0) {
        params.seed = time(NULL);
    }

    fprintf(stderr, "%s: seed = %d\n", __func__, params.seed);

    std::mt19937 rng(params.seed);
    // if (params.prompt.empty()) {
    //     params.prompt = gpt_random_prompt(rng);
    // }

//    params.prompt = R"(// this function checks if the number n is prime
//bool is_prime(int n) {)";

    int64_t t_load_us = 0;

    gpt_vocab vocab;
    llama_model model;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();
        if (!llama_model_load(params.model, model, vocab, params.n_ctx)) {  
            fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
            return 1;
        }

        t_load_us = ggml_time_us() - t_start_us;
    }

    // print system information
    {
        fprintf(stderr, "\n");
        fprintf(stderr, "system_info: n_threads = %d / %d | %s\n",
                params.n_threads, std::thread::hardware_concurrency(), llama_print_system_info());
    }

    int n_past = 0;

    int64_t t_sample_us  = 0;
    int64_t t_predict_us = 0;

    std::vector<float> logits;

    // Add a space in front of the first character to match OG llama tokenizer behavior
    // params.prompt.insert(0, 1, ' ');
    // tokenize the prompt
    std::vector<gpt_vocab::id> embd_inp;

    // params.n_predict = std::min(params.n_predict, model.hparams.n_ctx - (int) embd_inp.size());

    // // tokenize the reverse prompt
    // std::vector<gpt_vocab::id> antiprompt_inp = ::llama_tokenize(vocab, params.antiprompt, false);


    std::vector<gpt_vocab::id> instruct_inp = ::llama_tokenize(vocab, " Below is an instruction that describes a task. Write a response that appropriately completes the request.\n\n", true);
    std::vector<gpt_vocab::id> prompt_inp = ::llama_tokenize(vocab, "### Instruction:\n\n", true);
    std::vector<gpt_vocab::id> response_inp = ::llama_tokenize(vocab, "### Response:\n\n", false);
    embd_inp.insert(embd_inp.end(), instruct_inp.begin(), instruct_inp.end());

    if(!params.prompt.empty()) {
        std::vector<gpt_vocab::id> param_inp = ::llama_tokenize(vocab, params.prompt, true);
        embd_inp.insert(embd_inp.end(), prompt_inp.begin(), prompt_inp.end());
        embd_inp.insert(embd_inp.end(), param_inp.begin(), param_inp.end());
        embd_inp.insert(embd_inp.end(), response_inp.begin(), response_inp.end());
    }

    // fprintf(stderr, "\n");
    // fprintf(stderr, "%s: prompt: '%s'\n", __func__, params.prompt.c_str());
    // fprintf(stderr, "%s: number of tokens in prompt = %zu\n", __func__, embd_inp.size());
    // for (int i = 0; i < (int) embd_inp.size(); i++) {
    //     fprintf(stderr, "%6d -> '%s'\n", embd_inp[i], vocab.id_to_token.at(embd_inp[i]).c_str());
    // }
    // fprintf(stderr, "\n");

    if (params.interactive) {
#if defined (__unix__) || (defined (__APPLE__) && defined (__MACH__))
        struct sigaction sigint_action;
        sigint_action.sa_handler = sigint_handler;
        sigemptyset (&sigint_action.sa_mask);
        sigint_action.sa_flags = 0;
        sigaction(SIGINT, &sigint_action, NULL);
#elif defined (_WIN32)
        signal(SIGINT, sigint_handler);

        // Windows console ANSI color fix
        DWORD mode = 0;
        HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
        if (hConsole && hConsole != INVALID_HANDLE_VALUE && GetConsoleMode(hConsole, &mode)){
            SetConsoleMode(hConsole, mode | ENABLE_VIRTUAL_TERMINAL_PROCESSING);
            SetConsoleOutputCP(CP_UTF8);
        }
#endif

        fprintf(stderr, "%s: interactive mode on.\n", __func__);

        // if(antiprompt_inp.size()) {
        //     fprintf(stderr, "%s: reverse prompt: '%s'\n", __func__, params.antiprompt.c_str());
        //     fprintf(stderr, "%s: number of tokens in reverse prompt = %zu\n", __func__, antiprompt_inp.size());
        //     for (int i = 0; i < (int) antiprompt_inp.size(); i++) {
        //         fprintf(stderr, "%6d -> '%s'\n", antiprompt_inp[i], vocab.id_to_token.at(antiprompt_inp[i]).c_str());
        //     }
        //     fprintf(stderr, "\n");
        // }
    }
    fprintf(stderr, "sampling parameters: temp = %f, top_k = %d, top_p = %f, repeat_last_n = %i, repeat_penalty = %f\n", params.temp, params.top_k, params.top_p, params.repeat_last_n, params.repeat_penalty);
    fprintf(stderr, "\n\n");

    std::vector<gpt_vocab::id> embd;

    // determine the required inference memory per token:
    size_t mem_per_token = 0;
    llama_eval(model, params.n_threads, 0, { 0, 1, 2, 3 }, logits, mem_per_token);

    int last_n_size = params.repeat_last_n;
    std::vector<gpt_vocab::id> last_n_tokens(last_n_size);
    std::fill(last_n_tokens.begin(), last_n_tokens.end(), 0);


    if (params.interactive) {
        fprintf(stderr, "== Running in chat mode. ==\n"
#if defined (__unix__) || (defined (__APPLE__) && defined (__MACH__)) || defined (_WIN32)
               " - Press Ctrl+C to interject at any time.\n"
#endif
               " - Press Return to return control to LLaMA.\n"
               " - If you want to submit another line, end your input in '\\'.\n");
    }

    // we may want to slide the input window along with the context, but for now we restrict to the context length
    int remaining_tokens = model.hparams.n_ctx - embd_inp.size();
    int input_consumed = 0;
    bool input_noecho = true;

    // prompt user immediately after the starting prompt has been loaded
    if (params.interactive_start) {
        is_interacting = true;
    }

    // set the color for the prompt which will be output initially
    if (params.use_color) {
        printf(ANSI_COLOR_YELLOW);
    }

    

    while (remaining_tokens > 0) {
        // predict
        if (embd.size() > 0) {
            const int64_t t_start_us = ggml_time_us();

            if (!llama_eval(model, params.n_threads, n_past, embd, logits, mem_per_token)) {
                fprintf(stderr, "Failed to predict\n");
                return 1;
            }

            t_predict_us += ggml_time_us() - t_start_us;
        }

        n_past += embd.size();
        embd.clear();

        if (embd_inp.size() <= input_consumed && !is_interacting) {
            // out of user input, sample next token
            const float top_k = params.top_k;
            const float top_p = params.top_p;
            const float temp  = params.temp;
            const float repeat_penalty = params.repeat_penalty;

            const int n_vocab = model.hparams.n_vocab;

            gpt_vocab::id id = 0;

            {
                const int64_t t_start_sample_us = ggml_time_us();

                id = llama_sample_top_p_top_k(vocab, logits.data() + (logits.size() - n_vocab), last_n_tokens, repeat_penalty, top_k, top_p, temp, rng);

                last_n_tokens.erase(last_n_tokens.begin());
                last_n_tokens.push_back(id);

                t_sample_us += ggml_time_us() - t_start_sample_us;
            }

            // add it to the context
            embd.push_back(id);

            // echo this to console
            input_noecho = false;

            // decrement remaining sampling budget
            --remaining_tokens;
        } else {
            // some user input remains from prompt or interaction, forward it to processing
            while (embd_inp.size() > input_consumed) {
                // fprintf(stderr, "%6d -> '%s'\n", embd_inp[input_consumed], vocab.id_to_token.at(embd_inp[input_consumed]).c_str());

                embd.push_back(embd_inp[input_consumed]);
                last_n_tokens.erase(last_n_tokens.begin());
                last_n_tokens.push_back(embd_inp[input_consumed]);
                ++input_consumed;
                if (embd.size() > params.n_batch) {
                    break;
                }
            }

            // reset color to default if we there is no pending user input
            if (!input_noecho && params.use_color && embd_inp.size() == input_consumed) {
                printf(ANSI_COLOR_RESET);
            }
        }

        // display text
        if (!input_noecho) {
            for (auto id : embd) {
                printf("%s", vocab.id_to_token[id].c_str());
            }
            fflush(stdout);
        }

        // in interactive mode, and not currently processing queued inputs;
        // check if we should prompt the user for more
        if (params.interactive && embd_inp.size() <= input_consumed) {
            // check for reverse prompt
            // if (antiprompt_inp.size() && std::equal(antiprompt_inp.rbegin(), antiprompt_inp.rend(), last_n_tokens.rbegin())) {
            //     // reverse prompt found
            //     is_interacting = true;
            // }
            if (is_interacting) {
                // input_consumed =  0;
                // embd_inp.erase(embd_inp.begin());
                input_consumed = embd_inp.size();
                embd_inp.insert(embd_inp.end(), prompt_inp.begin(), prompt_inp.end());
                

                printf("\n> ");

                // currently being interactive
                bool another_line=true;
                while (another_line) {
                    fflush(stdout);
                    char buf[256] = {0};
                    int n_read;
                    if(params.use_color) printf(ANSI_BOLD ANSI_COLOR_GREEN);
                    if (scanf("%255[^\n]%n%*c", buf, &n_read) <= 0) {
                        // presumable empty line, consume the newline
                        if (scanf("%*c") <= 0) { /*ignore*/ }
                        n_read=0;
                    }
                    if(params.use_color) printf(ANSI_COLOR_RESET);

                    if (n_read > 0 && buf[n_read-1]=='\\') {
                        another_line = true;
                        buf[n_read-1] = '\n';
                        buf[n_read] = 0;
                    } else {
                        another_line = false;
                        buf[n_read] = '\n';
                        buf[n_read+1] = 0;
                    }

                    std::vector<gpt_vocab::id> line_inp = ::llama_tokenize(vocab, buf, false);
                    embd_inp.insert(embd_inp.end(), line_inp.begin(), line_inp.end());
                    embd_inp.insert(embd_inp.end(), response_inp.begin(), response_inp.end());

                    remaining_tokens -= prompt_inp.size() + line_inp.size() + response_inp.size();

                    input_noecho = true; // do not echo this again
                }

                is_interacting = false;
            }
        }

        // end of text token
        if (embd.back() == 2) {
            if (params.interactive) {
                is_interacting = true;
                continue;
            } else {
                printf("\n");
                fprintf(stderr, " [end of text]\n");
                break;
            }
        }
    }

#if defined (_WIN32)
    signal(SIGINT, SIG_DFL);
#endif

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        fprintf(stderr, "\n\n");
        fprintf(stderr, "%s: mem per token = %8zu bytes\n", __func__, mem_per_token);
        fprintf(stderr, "%s:     load time = %8.2f ms\n", __func__, t_load_us/1000.0f);
        fprintf(stderr, "%s:   sample time = %8.2f ms\n", __func__, t_sample_us/1000.0f);
        fprintf(stderr, "%s:  predict time = %8.2f ms / %.2f ms per token\n", __func__, t_predict_us/1000.0f, t_predict_us/1000.0f/n_past);
        fprintf(stderr, "%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    ggml_free(model.ctx);

    if (params.use_color) {
        printf(ANSI_COLOR_RESET);
    }

    return 0;
}